

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int invalidateTempStorage(Parse *pParse)

{
  sqlite3 *psVar1;
  int iVar2;
  sqlite3 *in_RDI;
  sqlite3 *db;
  int local_4;
  
  psVar1 = (sqlite3 *)in_RDI->pVfs;
  if (psVar1->aDb[1].pBt == (Btree *)0x0) {
LAB_0021e4eb:
    local_4 = 0;
  }
  else {
    if (psVar1->autoCommit != '\0') {
      iVar2 = sqlite3BtreeTxnState(psVar1->aDb[1].pBt);
      if (iVar2 == 0) {
        sqlite3BtreeClose((Btree *)in_RDI);
        psVar1->aDb[1].pBt = (Btree *)0x0;
        sqlite3ResetAllSchemasOfConnection(in_RDI);
        goto LAB_0021e4eb;
      }
    }
    sqlite3ErrorMsg((Parse *)in_RDI,"temporary storage cannot be changed from within a transaction")
    ;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int invalidateTempStorage(Parse *pParse){
  sqlite3 *db = pParse->db;
  if( db->aDb[1].pBt!=0 ){
    if( !db->autoCommit
     || sqlite3BtreeTxnState(db->aDb[1].pBt)!=SQLITE_TXN_NONE
    ){
      sqlite3ErrorMsg(pParse, "temporary storage cannot be changed "
        "from within a transaction");
      return SQLITE_ERROR;
    }
    sqlite3BtreeClose(db->aDb[1].pBt);
    db->aDb[1].pBt = 0;
    sqlite3ResetAllSchemasOfConnection(db);
  }
  return SQLITE_OK;
}